

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

int lyd_defaults_add_unres
              (lyd_node **root,int options,ly_ctx *ctx,lys_module **modules,int mod_count,
              lyd_node *data_tree,lyd_node *act_notif,unres_data *unres,int wd)

{
  LYS_NODE LVar1;
  lys_module *plVar2;
  int iVar3;
  uint uVar4;
  ly_set *set;
  char *format;
  lys_node *plVar5;
  lyd_node *plVar6;
  ly_ctx *ctx_00;
  undefined8 uVar7;
  lys_node *unaff_R13;
  lyd_node **root_00;
  lyd_node *plVar8;
  int iVar9;
  bool bVar10;
  lys_node *local_60;
  lys_node *local_58;
  ulong local_40;
  lyd_node *local_38;
  
  if (root == (lyd_node **)0x0) {
LAB_0016d6d2:
    __assert_fail("root && (*root || ctx) && unres && !(options & LYD_OPT_ACT_NOTIF)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                  ,0x1dd8,
                  "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                 );
  }
  plVar8 = *root;
  if (((((uint)options >> 8 & 1) != 0) || (unres == (unres_data *)0x0)) ||
     (ctx == (ly_ctx *)0x0 && plVar8 == (lyd_node *)0x0)) goto LAB_0016d6d2;
  if (ctx == (ly_ctx *)0x0) {
    ctx = plVar8->schema->module->ctx;
    bVar10 = false;
  }
  else {
    bVar10 = plVar8 == (lyd_node *)0x0;
    if (bVar10 && ((uint)options >> 0xc & 1) != 0) {
      format = "Cannot add default values for one module (LYD_OPT_NOSIBLINGS) without any data.";
      goto LAB_0016cfc8;
    }
  }
  if ((options & 0x70U) != 0) {
    if (bVar10) {
      format = 
      "Cannot add default values to RPC, RPC reply, and notification without at least the empty container."
      ;
      goto LAB_0016cfc8;
    }
    if ((act_notif == (lyd_node *)0x0 && (options & 0x10U) != 0) &&
       (plVar8->schema->nodetype != LYS_RPC)) {
      format = "Not valid RPC/action data.";
      goto LAB_0016cfc8;
    }
    if ((options & 0x20U) == 0 || act_notif != (lyd_node *)0x0) {
      if ((options & 0x40U) == 0 || act_notif != (lyd_node *)0x0) {
        plVar6 = act_notif;
        if (act_notif == (lyd_node *)0x0) {
LAB_0016d08a:
          plVar6 = plVar8;
        }
        local_60 = plVar6->schema;
        goto LAB_0016d09c;
      }
      if (plVar8->schema->nodetype == LYS_NOTIF) goto LAB_0016d08a;
    }
    else {
      if (plVar8->schema->nodetype != LYS_RPC) {
        format = "Not valid reply data.";
        goto LAB_0016cfc8;
      }
      if ((options & 0x40U) == 0) goto LAB_0016d08a;
    }
    format = "Not valid notification data.";
    goto LAB_0016cfc8;
  }
  if ((!bVar10) && (plVar8->parent != (lyd_node *)0x0)) {
    options = options | 0x1000;
  }
  local_60 = (lys_node *)0x0;
LAB_0016d09c:
  if (wd != 0) {
    root_00 = &act_notif;
    if (act_notif == (lyd_node *)0x0) {
      root_00 = root;
    }
    if (((uint)options >> 8 & 1) != 0) {
      __assert_fail("root && !(options & LYD_OPT_ACT_NOTIF)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                    ,0x1d7c,
                    "int lyd_wd_add(struct lyd_node **, struct ly_ctx *, const struct lys_module **, int, struct unres_data *, int)"
                   );
    }
    plVar8 = *root_00;
    if (ctx == (ly_ctx *)0x0 && plVar8 == (lyd_node *)0x0) {
      __assert_fail("*root || ctx",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                    ,0x1d7d,
                    "int lyd_wd_add(struct lyd_node **, struct ly_ctx *, const struct lys_module **, int, struct unres_data *, int)"
                   );
    }
    if (((uint)options >> 0xc & 1) != 0 && plVar8 == (lyd_node *)0x0) {
      __assert_fail("!(options & LYD_OPT_NOSIBLINGS) || *root",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                    ,0x1d7e,
                    "int lyd_wd_add(struct lyd_node **, struct ly_ctx *, const struct lys_module **, int, struct unres_data *, int)"
                   );
    }
    if ((options & 0xeU) == 0) {
      ctx_00 = ctx;
      if (ctx == (ly_ctx *)0x0) {
        ctx_00 = plVar8->schema->module->ctx;
      }
      if ((options & 0x10000f1U) == 0 || (options & 1U) != 0) {
        if (((uint)options >> 0xc & 1) != 0) {
LAB_0016d5d9:
          iVar3 = lyd_wd_add_subtree(root_00,(lyd_node *)0x0,(lyd_node *)0x0,plVar8->schema,1,
                                     options,unres);
          goto LAB_0016d5ff;
        }
        if (modules == (lys_module **)0x0 || mod_count == 0) {
          iVar3 = (ctx_00->models).used;
          if (0 < iVar3) {
            local_40 = 0;
            do {
              plVar2 = (ctx_00->models).list[local_40];
              if (((*(ushort *)&plVar2->field_0x40 & 0xc0) == 0x80) &&
                 (unaff_R13 = plVar2->data, unaff_R13 != (lys_node *)0x0)) {
                do {
                  if (((unaff_R13->nodetype & 0x903f) != LYS_UNKNOWN) &&
                     (iVar3 = lyd_wd_add_subtree(root_00,(lyd_node *)0x0,(lyd_node *)0x0,unaff_R13,1
                                                 ,options,unres), iVar3 != 0)) {
                    return 1;
                  }
                  unaff_R13 = unaff_R13->next;
                } while (unaff_R13 != (lys_node *)0x0);
                iVar3 = (ctx_00->models).used;
                unaff_R13 = (lys_node *)0x0;
              }
              local_40 = local_40 + 1;
            } while ((long)local_40 < (long)iVar3);
          }
        }
        else if (0 < mod_count) {
          local_40 = 0;
          do {
            for (plVar5 = modules[local_40]->data; plVar5 != (lys_node *)0x0; plVar5 = plVar5->next)
            {
              if (((plVar5->nodetype & 0x903f) != LYS_UNKNOWN) &&
                 (iVar3 = lyd_wd_add_subtree(root_00,(lyd_node *)0x0,(lyd_node *)0x0,plVar5,1,
                                             options,unres), iVar3 != 0)) {
                return 1;
              }
            }
            local_40 = local_40 + 1;
          } while (local_40 != (uint)mod_count);
          unaff_R13 = (lys_node *)0x0;
        }
      }
      else if ((options & 0x40U) == 0) {
        if ((options & 0x30U) == 0) {
          if (((uint)options >> 0x18 & 1) == 0) {
            uVar7 = 0x1dc7;
            goto LAB_0016d1d6;
          }
          goto LAB_0016d5d9;
        }
        if ((plVar8 == (lyd_node *)0x0) ||
           ((plVar8->schema->nodetype & (LYS_ACTION|LYS_RPC)) == LYS_UNKNOWN)) {
          format = "Subtree is not a single RPC/action/reply.";
          ctx = ctx_00;
          goto LAB_0016cfc8;
        }
        plVar5 = plVar8->schema->child;
        if ((options & 0x10U) == 0) {
          for (; plVar5 != (lys_node *)0x0; plVar5 = plVar5->next) {
            if (plVar5->nodetype == LYS_OUTPUT) goto LAB_0016d4cb;
          }
        }
        else {
          for (; plVar5 != (lys_node *)0x0; plVar5 = plVar5->next) {
            if (plVar5->nodetype == LYS_INPUT) goto LAB_0016d4cb;
          }
        }
      }
      else {
        if ((plVar8 == (lyd_node *)0x0) || (plVar5 = plVar8->schema, plVar5->nodetype != LYS_NOTIF))
        {
          format = "Subtree is not a single notification.";
          ctx = ctx_00;
LAB_0016cfc8:
          ly_log(ctx,LY_LLERR,LY_EINVAL,format);
          return 1;
        }
LAB_0016d4cb:
        iVar3 = lyd_wd_add_subtree(root_00,plVar8,plVar8,plVar5,0,options,unres);
LAB_0016d5ff:
        if (iVar3 != 0) {
          return 1;
        }
      }
    }
  }
  if (unres->count == 0) {
    return 0;
  }
  plVar8 = *root;
  if (plVar8 == (lyd_node *)0x0) {
    uVar7 = 0x1e06;
    ctx_00 = ctx;
LAB_0016d1d6:
    ly_log(ctx_00,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
           ,uVar7);
    return 1;
  }
  bVar10 = (options & 0x70U) != 0;
  if (bVar10 && data_tree != (lyd_node *)0x0) {
    local_58 = (lys_node *)data_tree;
    if (act_notif == (lyd_node *)0x0) {
      local_38 = (lyd_node *)0x0;
      unaff_R13 = (lys_node *)0x0;
    }
    else {
      local_38 = (lyd_node *)0x0;
      plVar6 = plVar8;
      plVar5 = (lys_node *)0x0;
      do {
        while ((unaff_R13 = local_58, (lys_node *)unaff_R13->name != plVar6->schema ||
               ((plVar6->schema->nodetype == LYS_LIST &&
                (iVar3 = lyd_list_equal((lyd_node *)unaff_R13,plVar6,0), iVar3 == 0))))) {
          local_58 = *(lys_node **)&unaff_R13->flags;
          plVar8 = plVar6;
          if (*(lys_node **)&unaff_R13->flags == (lys_node *)0x0) goto LAB_0016d36d;
        }
        plVar8 = plVar6->child;
        if (plVar8 == (lyd_node *)0x0) {
          __assert_fail("msg_sibling->child",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                        ,0x1e27,
                        "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                       );
        }
        local_58 = unaff_R13->parent;
        while (LVar1 = plVar8->schema->nodetype, LVar1 == LYS_LEAF) {
          plVar8 = plVar8->next;
          if (plVar8 == (lyd_node *)0x0) {
            __assert_fail("msg_sibling->next",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                          ,0x1e2b,
                          "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                         );
          }
        }
        local_38 = plVar6;
        if ((LVar1 & (LYS_ACTION|LYS_NOTIF)) != LYS_UNKNOWN) {
          if (act_notif->parent == (lyd_node *)0x0) {
            __assert_fail("act_notif->parent",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                          ,0x1e2f,
                          "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                         );
          }
          if (act_notif->parent->schema != (lys_node *)unaff_R13->name) {
            __assert_fail("act_notif->parent->schema == data_tree_parent->schema",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                          ,0x1e30,
                          "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                         );
          }
          if (plVar8 != act_notif) {
            __assert_fail("msg_sibling == act_notif",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                          ,0x1e31,
                          "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                         );
          }
          goto LAB_0016d371;
        }
        plVar5 = unaff_R13;
        plVar6 = plVar8;
      } while (local_58 != (lys_node *)0x0);
LAB_0016d36d:
      local_58 = (lys_node *)0x0;
      unaff_R13 = plVar5;
LAB_0016d371:
      if (unaff_R13 == (lys_node *)0x0) {
        local_58 = (lys_node *)data_tree;
      }
    }
    lyd_unlink_internal(plVar8,0);
    if (unaff_R13 == (lys_node *)0x0 && local_58 == (lys_node *)0x0) {
      __assert_fail("data_tree_parent || data_tree_sibling",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                    ,0x1e46,
                    "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                   );
    }
    if (unaff_R13 == (lys_node *)0x0) {
      if (local_58->iffeature != (lys_iffeature *)0x0) {
        __assert_fail("!data_tree_sibling->parent",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                      ,0x1e4c,
                      "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                     );
      }
      unaff_R13 = (lys_node *)0x0;
      iVar3 = lyd_insert_nextto((lyd_node *)local_58->ext,plVar8,0,0);
    }
    else {
      iVar3 = lyd_insert_common((lyd_node *)unaff_R13,(lyd_node **)0x0,plVar8,0);
    }
    iVar9 = 1;
    if (iVar3 != 0) goto LAB_0016d421;
  }
  else {
    plVar8 = (lyd_node *)0x0;
    local_38 = (lyd_node *)0x0;
  }
  iVar3 = resolve_unres_data(ctx,unres,root,options);
  iVar9 = 1;
  if (iVar3 != 0) goto LAB_0016d421;
  if ((options & 0x70U) == 0) {
    return 0;
  }
  if (data_tree == (lyd_node *)0x0) {
    if (*root != (lyd_node *)0x0) {
      set = lyd_find_instance(*root,local_60);
      if ((set == (ly_set *)0x0) || (uVar4 = set->number, 1 < uVar4)) {
        __assert_fail("set && ((set->number == 0) || (set->number == 1))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                      ,0x1e62,
                      "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                     );
      }
      goto LAB_0016d638;
    }
    set = (ly_set *)0x0;
  }
  else {
    if (unaff_R13 != (lys_node *)0x0) {
      local_58 = unaff_R13;
    }
    set = lyd_find_instance((lyd_node *)local_58,local_60);
    if ((set == (ly_set *)0x0) || (uVar4 = set->number, 1 < uVar4)) {
      __assert_fail("set && ((set->number == 0) || (set->number == 1))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                    ,0x1e5f,
                    "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                   );
    }
LAB_0016d638:
    if (uVar4 != 0) {
      free((set->set).s);
      free(set);
      iVar9 = 0;
      goto LAB_0016d421;
    }
  }
  ly_vlog(ctx,LYE_SPEC,LY_VLOG_LYS,local_60,
          "Operation/notification not supported because of the current configuration.");
  ly_set_free(set);
LAB_0016d421:
  if ((bVar10 && data_tree != (lyd_node *)0x0) &&
     (lyd_unlink_internal(plVar8,0), local_38 != (lyd_node *)0x0)) {
    lyd_insert_common(local_38,(lyd_node **)0x0,plVar8,0);
  }
  return iVar9;
}

Assistant:

int
lyd_defaults_add_unres(struct lyd_node **root, int options, struct ly_ctx *ctx, const struct lys_module **modules,
                       int mod_count, const struct lyd_node *data_tree, struct lyd_node *act_notif,
                       struct unres_data *unres, int wd)
{
    struct lyd_node *msg_sibling = NULL, *msg_parent = NULL, *data_tree_sibling, *data_tree_parent;
    struct lys_node *msg_op = NULL;
    struct ly_set *set;
    int ret = EXIT_FAILURE;

    assert(root && (*root || ctx) && unres && !(options & LYD_OPT_ACT_NOTIF));

    if (!ctx) {
        ctx = (*root)->schema->module->ctx;
    }

    if ((options & LYD_OPT_NOSIBLINGS) && !(*root)) {
        LOGERR(ctx, LY_EINVAL, "Cannot add default values for one module (LYD_OPT_NOSIBLINGS) without any data.");
        return EXIT_FAILURE;
    }

    if (options & (LYD_OPT_RPC | LYD_OPT_RPCREPLY | LYD_OPT_NOTIF)) {
        if (!(*root)) {
            LOGERR(ctx, LY_EINVAL, "Cannot add default values to RPC, RPC reply, and notification without at least the empty container.");
            return EXIT_FAILURE;
        }
        if ((options & LYD_OPT_RPC) && !act_notif && ((*root)->schema->nodetype != LYS_RPC)) {
            LOGERR(ctx, LY_EINVAL, "Not valid RPC/action data.");
            return EXIT_FAILURE;
        }
        if ((options & LYD_OPT_RPCREPLY) && !act_notif && ((*root)->schema->nodetype != LYS_RPC)) {
            LOGERR(ctx, LY_EINVAL, "Not valid reply data.");
            return EXIT_FAILURE;
        }
        if ((options & LYD_OPT_NOTIF) && !act_notif && ((*root)->schema->nodetype != LYS_NOTIF)) {
            LOGERR(ctx, LY_EINVAL, "Not valid notification data.");
            return EXIT_FAILURE;
        }

        /* remember the operation/notification schema */
        msg_op = act_notif ? act_notif->schema : (*root)->schema;
    } else if (*root && (*root)->parent) {
        /* we have inner node, so it will be considered as
         * a root of subtree where to add default nodes and
         * no of its siblings will be affected */
        options |= LYD_OPT_NOSIBLINGS;
    }

    /* add missing default nodes */
    if (wd && lyd_wd_add((act_notif ? &act_notif : root), ctx, modules, mod_count, unres, options)) {
        return EXIT_FAILURE;
    }

    /* check leafrefs and/or instids if any */
    if (unres && unres->count) {
        if (!(*root)) {
            LOGINT(ctx);
            return EXIT_FAILURE;
        }

        /* temporarily link the additional data tree to the RPC/action/notification */
        if (data_tree && (options & (LYD_OPT_RPC | LYD_OPT_RPCREPLY | LYD_OPT_NOTIF))) {
            /* duplicate the message tree - if it gets deleted we would not be able to positively identify it */
            msg_parent = NULL;
            msg_sibling = *root;

            if (act_notif) {
                /* fun case */
                data_tree_parent = NULL;
                data_tree_sibling = (struct lyd_node *)data_tree;
                while (data_tree_sibling) {
                    while (data_tree_sibling) {
                        if ((data_tree_sibling->schema == msg_sibling->schema)
                                && ((msg_sibling->schema->nodetype != LYS_LIST)
                                    || lyd_list_equal(data_tree_sibling, msg_sibling, 0))) {
                            /* match */
                            break;
                        }

                        data_tree_sibling = data_tree_sibling->next;
                    }

                    if (data_tree_sibling) {
                        /* prepare for the new data_tree iteration */
                        data_tree_parent = data_tree_sibling;
                        data_tree_sibling = data_tree_sibling->child;

                        /* find new action sibling to search for later (skip list keys) */
                        msg_parent = msg_sibling;
                        assert(msg_sibling->child);
                        for (msg_sibling = msg_sibling->child;
                                msg_sibling->schema->nodetype == LYS_LEAF;
                                msg_sibling = msg_sibling->next) {
                            assert(msg_sibling->next);
                        }
                        if (msg_sibling->schema->nodetype & (LYS_ACTION | LYS_NOTIF)) {
                            /* we are done */
                            assert(act_notif->parent);
                            assert(act_notif->parent->schema == data_tree_parent->schema);
                            assert(msg_sibling == act_notif);
                            break;
                        }
                    }
                }

                /* loop ended after the first iteration, set the values correctly */
                if (!data_tree_parent) {
                    data_tree_sibling = (struct lyd_node *)data_tree;
                }

            } else {
                /* easy case */
                data_tree_parent = NULL;
                data_tree_sibling = (struct lyd_node *)data_tree;
            }

            /* unlink msg_sibling if needed (won't do anything otherwise) */
            lyd_unlink_internal(msg_sibling, 0);

            /* now we can insert msg_sibling into data_tree_parent or next to data_tree_sibling */
            assert(data_tree_parent || data_tree_sibling);
            if (data_tree_parent) {
                if (lyd_insert_common(data_tree_parent, NULL, msg_sibling, 0)) {
                    goto unlink_datatree;
                }
            } else {
                assert(!data_tree_sibling->parent);
                if (lyd_insert_nextto(data_tree_sibling->prev, msg_sibling, 0, 0)) {
                    goto unlink_datatree;
                }
            }
        }

        if (resolve_unres_data(ctx, unres, root, options)) {
            goto unlink_datatree;
        }

        /* we are done */
        ret = EXIT_SUCCESS;

        /* check that the operation/notification tree was not removed */
        if (options & (LYD_OPT_RPC | LYD_OPT_RPCREPLY | LYD_OPT_NOTIF)) {
            set = NULL;
            if (data_tree) {
                set = lyd_find_instance(data_tree_parent ? data_tree_parent : data_tree_sibling, msg_op);
                assert(set && ((set->number == 0) || (set->number == 1)));
            } else if (*root) {
                set = lyd_find_instance(*root, msg_op);
                assert(set && ((set->number == 0) || (set->number == 1)));
            }
            if (!set || !set->number) {
                /* it was removed, handle specially */
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_LYS, msg_op, "Operation/notification not supported because of the current configuration.");
                ret = EXIT_FAILURE;
            }
            ly_set_free(set);
        }

unlink_datatree:
        /* put the trees back in order */
        if (data_tree && (options & (LYD_OPT_RPC | LYD_OPT_RPCREPLY | LYD_OPT_NOTIF))) {
            /* unlink and insert it back, if there is a parent  */
            lyd_unlink_internal(msg_sibling, 0);
            if (msg_parent) {
                lyd_insert_common(msg_parent, NULL, msg_sibling, 0);
            }
        }
    } else {
        /* we are done */
        ret = EXIT_SUCCESS;
    }

    return ret;
}